

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int bc_put_atom(BCWriterState *s,JSAtom atom)

{
  int iVar1;
  int extraout_EAX;
  uint32_t local_c;
  
  if ((int)atom < 0) {
    local_c = atom * 2 + 1;
  }
  else {
    iVar1 = bc_atom_to_idx(s,&local_c,atom);
    if (iVar1 != 0) {
      return iVar1;
    }
    local_c = local_c * 2;
  }
  dbuf_put_leb128(&s->dbuf,local_c);
  return extraout_EAX;
}

Assistant:

static int bc_put_atom(BCWriterState *s, JSAtom atom)
{
    uint32_t v;

    if (__JS_AtomIsTaggedInt(atom)) {
        v = (__JS_AtomToUInt32(atom) << 1) | 1;
    } else {
        if (bc_atom_to_idx(s, &v, atom))
            return -1;
        v <<= 1;
    }
    bc_put_leb128(s, v);
    return 0;
}